

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cpp
# Opt level: O2

void __thiscall xercesc_4_0::Match::setNoGroups(Match *this,int n)

{
  int *piVar1;
  int iVar2;
  undefined4 extraout_var;
  int *piVar3;
  int i;
  long lVar4;
  undefined4 extraout_var_00;
  
  if ((this->fNoGroups < 1) || (this->fPositionsSize < n)) {
    cleanUp(this);
    this->fPositionsSize = n;
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(long)n << 2);
    this->fStartPositions = (int *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(long)n << 2);
    piVar3 = (int *)CONCAT44(extraout_var_00,iVar2);
    this->fEndPositions = piVar3;
  }
  else {
    piVar3 = this->fEndPositions;
  }
  this->fNoGroups = n;
  piVar1 = this->fStartPositions;
  for (lVar4 = 0; lVar4 < this->fPositionsSize; lVar4 = lVar4 + 1) {
    piVar1[lVar4] = -1;
    piVar3[lVar4] = -1;
  }
  return;
}

Assistant:

void Match::setNoGroups(const int n) {

    if (fNoGroups <= 0 || fPositionsSize < n) {

        cleanUp();
        fPositionsSize = n;
        fStartPositions = (int*) fMemoryManager->allocate(n * sizeof(int));//new int[n];
        fEndPositions = (int*) fMemoryManager->allocate(n * sizeof(int));//new int[n];
    }

    fNoGroups = n;

    for (int i=0; i< fPositionsSize; i++) {

        fStartPositions[i] = -1;
        fEndPositions[i] = -1;
    }
}